

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar xmlPopInput(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlParserInputPtr *ppxVar2;
  xmlParserInputPtr input;
  xmlChar xVar3;
  uint uVar4;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    iVar1 = ctxt->inputNr;
    if ((long)iVar1 < 2) {
      xVar3 = '\0';
    }
    else {
      uVar4 = iVar1 - 1;
      ctxt->inputNr = uVar4;
      ppxVar2 = ctxt->inputTab;
      ctxt->input = ppxVar2[(long)iVar1 + -2];
      input = ppxVar2[uVar4];
      ppxVar2[uVar4] = (xmlParserInputPtr)0x0;
      xmlFreeInputStream(input);
      xVar3 = *ctxt->input->cur;
      if (xVar3 == '\0') {
        xmlParserGrow(ctxt);
        xVar3 = *ctxt->input->cur;
      }
    }
    return xVar3;
  }
  return '\0';
}

Assistant:

xmlChar
xmlPopInput(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (ctxt->inputNr <= 1)) return(0);
    input = xmlCtxtPopInput(ctxt);
    xmlFreeInputStream(input);
    if (*ctxt->input->cur == 0)
        xmlParserGrow(ctxt);
    return(CUR);
}